

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean bad_rock(permonst *mdat,boolean is_player,xchar x,xchar y)

{
  boolean bVar1;
  obj *poVar2;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  byte local_15;
  byte local_14;
  xchar y_local;
  xchar x_local;
  boolean is_player_local;
  permonst *mdat_local;
  
  if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
    poVar2 = sobj_at(0x214,level,(int)x,(int)y);
    local_14 = 1;
    if (poVar2 != (obj *)0x0) goto LAB_001e1c9c;
  }
  local_15 = 0;
  if (level->locations[x][y].typ < '\x11') {
    if (((mdat->mflags1 & 0x20) != 0) && ((mdat->mflags1 & 0x40) == 0)) {
      bVar1 = may_dig(level,x,y);
      local_15 = 0;
      if (bVar1 != '\0') goto LAB_001e1c96;
    }
    bVar1 = may_passwall(level,x,y);
    local_16 = false;
    if (bVar1 != '\0') {
      local_17 = true;
      if ((mdat->mflags1 & 8) == 0) {
        local_18 = false;
        if (is_player != '\0') {
          local_19 = true;
          if ((u.uprops[0x3e].intrinsic == 0) && (local_19 = true, u.uprops[0x3e].extrinsic == 0)) {
            local_19 = ((youmonst.data)->mflags1 & 8) != 0;
          }
          local_18 = local_19;
        }
        local_17 = local_18;
      }
      local_16 = local_17;
    }
    local_15 = local_16 ^ 0xff;
  }
LAB_001e1c96:
  local_14 = local_15;
LAB_001e1c9c:
  return local_14 & 1;
}

Assistant:

boolean bad_rock(const struct permonst *mdat, boolean is_player, xchar x, xchar y)
{
	return (boolean) ((In_sokoban(&u.uz) && sobj_at(BOULDER, level, x,y)) ||
	       (IS_ROCK(level->locations[x][y].typ)
		    && (!tunnels(mdat) || needspick(mdat) || !may_dig(level, x,y))
		    && !(may_passwall(level, x,y)
			&& (passes_walls(mdat) || (is_player && Passes_walls)))));
}